

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dzsum1.c
# Opt level: O2

double dzsum1_slu(int *n,doublecomplex *cx,int *incx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  iVar3 = *n;
  if (iVar3 < 1) {
    dVar6 = 0.0;
  }
  else {
    iVar2 = *incx;
    if (iVar2 == 1) {
      dVar6 = 0.0;
      for (lVar4 = 1; lVar4 <= iVar3; lVar4 = lVar4 + 1) {
        dVar7 = z_abs(cx);
        dVar6 = dVar6 + dVar7;
        iVar3 = *n;
        cx = cx + 1;
      }
    }
    else {
      iVar3 = iVar3 * iVar2;
      dVar6 = 0.0;
      iVar5 = 1;
      while( true ) {
        bVar1 = iVar5 <= iVar3;
        if (iVar2 < 0) {
          bVar1 = iVar3 <= iVar5;
        }
        if (!bVar1) break;
        dVar7 = z_abs(cx + (long)iVar5 + -1);
        dVar6 = dVar6 + dVar7;
        iVar2 = *incx;
        iVar5 = iVar5 + iVar2;
      }
    }
  }
  return dVar6;
}

Assistant:

double dzsum1_slu(int *n, doublecomplex *cx, int *incx)
{

    /* Builtin functions */
    double z_abs(doublecomplex *);
    
    /* Local variables */
    int i, nincx;
    double stemp;


#define CX(I) cx[(I)-1]

    stemp = 0.;
    if (*n <= 0) {
	return stemp;
    }
    if (*incx == 1) {
	goto L20;
    }

    /*     CODE FOR INCREMENT NOT EQUAL TO 1 */

    nincx = *n * *incx;
    for (i = 1; *incx < 0 ? i >= nincx : i <= nincx; i += *incx) {

	/*        NEXT LINE MODIFIED. */

	stemp += z_abs(&CX(i));
/* L10: */
    }
    
    return stemp;

    /*     CODE FOR INCREMENT EQUAL TO 1 */

L20:
    for (i = 1; i <= *n; ++i) {

	/*        NEXT LINE MODIFIED. */

	stemp += z_abs(&CX(i));
/* L30: */
    }
    
    return stemp;

    /*     End of DZSUM1 */

}